

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O1

void __thiscall
sjtu::FileManager<std::pair<sjtu::orderType,_long>_>::FileManager
          (FileManager<std::pair<sjtu::orderType,_long>_> *this,string *filepath,uint cache_size)

{
  pointer pcVar1;
  long *local_50 [2];
  long local_40 [2];
  
  (this->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>)._vptr_FileManager_Base =
       (_func_int **)&PTR___cxa_pure_virtual_00123cc8;
  std::fstream::fstream(&(this->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).file);
  (this->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>)._vptr_FileManager_Base =
       (_func_int **)&PTR_init_00123c60;
  (this->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).cache =
       (LRUCache<std::pair<sjtu::orderType,_long>_> *)0x0;
  pcVar1 = (filepath->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + filepath->_M_string_length);
  (**(this->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>)._vptr_FileManager_Base)
            (this,local_50,(ulong)cache_size,0);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

FileManager(std::string filepath , unsigned int cache_size) {cache = nullptr , init(filepath , cache_size);}